

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::operator=(Player *this,Player *rhs)

{
  Hand *pHVar1;
  list<Observer_*,_std::allocator<Observer_*>_> *plVar2;
  
  this->pPlayerId = rhs->pPlayerId;
  this->pDiceRoller = rhs->pDiceRoller;
  pHVar1 = rhs->pCards;
  this->pOwnedCountries = rhs->pOwnedCountries;
  this->pCards = pHVar1;
  this->strategy = rhs->strategy;
  plVar2 = rhs->pObservers;
  this->currentState = rhs->currentState;
  this->pObservers = plVar2;
  return;
}

Assistant:

void Player::operator=(const Player &rhs) {
    this->pOwnedCountries = rhs.pOwnedCountries;
    this->pPlayerId = rhs.pPlayerId;
    this->pDiceRoller = rhs.pDiceRoller;
    this->pCards = rhs.pCards;
    this->strategy = rhs.strategy;
    this->pObservers = rhs.pObservers;
    this->currentState = rhs.currentState;
}